

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.cxx
# Opt level: O0

void undo_clear(void)

{
  char *__name;
  int local_80c;
  char local_808 [4];
  int i;
  char filename [2048];
  
  for (local_80c = 0; local_80c <= undo_max; local_80c = local_80c + 1) {
    __name = undo_filename(local_80c,local_808,0x800);
    unlink(__name);
  }
  undo_max = 0;
  undo_last = 0;
  undo_current = 0;
  if (modflag == 0) {
    undo_save = 0;
  }
  else {
    undo_save = -1;
  }
  return;
}

Assistant:

void undo_clear() {
  char	filename[FL_PATH_MAX];			// Undo checkpoint filename


  // Remove old checkpoint files...
  for (int i = 0; i <= undo_max; i ++) {
    unlink(undo_filename(i, filename, sizeof(filename)));
  }

  // Reset current, last, and save indices...
  undo_current = undo_last = undo_max = 0;
  if (modflag) undo_save = -1;
  else undo_save = 0;
}